

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::getInfo2
          (btGeneric6DofSpring2Constraint *this,btConstraintInfo2 *info)

{
  long in_RDI;
  btVector3 *in_stack_00000010;
  btTransform *in_stack_00000018;
  btTransform *in_stack_00000020;
  int row;
  btVector3 *angVelB;
  btVector3 *angVelA;
  btVector3 *linVelB;
  btVector3 *linVelA;
  btTransform *transB;
  btTransform *transA;
  btVector3 *in_stack_00000068;
  btVector3 *in_stack_00000070;
  btVector3 *in_stack_00000078;
  btTransform *in_stack_00000080;
  btTransform *in_stack_00000088;
  int in_stack_00000094;
  btConstraintInfo2 *in_stack_00000098;
  btGeneric6DofSpring2Constraint *in_stack_000000a0;
  btVector3 *in_stack_000000d0;
  btVector3 *in_stack_000000d8;
  btVector3 *in_stack_000000e0;
  
  btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x28));
  btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x30));
  btRigidBody::getLinearVelocity(*(btRigidBody **)(in_RDI + 0x28));
  btRigidBody::getLinearVelocity(*(btRigidBody **)(in_RDI + 0x30));
  btRigidBody::getAngularVelocity(*(btRigidBody **)(in_RDI + 0x28));
  btRigidBody::getAngularVelocity(*(btRigidBody **)(in_RDI + 0x30));
  setAngularLimits((btGeneric6DofSpring2Constraint *)linVelB,(btConstraintInfo2 *)angVelA,
                   angVelB._4_4_,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                   (btVector3 *)this,in_stack_00000068,in_stack_00000070);
  setLinearLimits(in_stack_000000a0,in_stack_00000098,in_stack_00000094,in_stack_00000088,
                  in_stack_00000080,in_stack_00000078,in_stack_000000d0,in_stack_000000d8,
                  in_stack_000000e0);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::getInfo2 (btConstraintInfo2* info)
{
	const btTransform& transA = m_rbA.getCenterOfMassTransform();
	const btTransform& transB = m_rbB.getCenterOfMassTransform();
	const btVector3& linVelA = m_rbA.getLinearVelocity();
	const btVector3& linVelB = m_rbB.getLinearVelocity();
	const btVector3& angVelA = m_rbA.getAngularVelocity();
	const btVector3& angVelB = m_rbB.getAngularVelocity();

	// for stability better to solve angular limits first
	int row = setAngularLimits(info, 0,transA,transB,linVelA,linVelB,angVelA,angVelB);
	setLinearLimits(info, row, transA,transB,linVelA,linVelB,angVelA,angVelB);
}